

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall
cmStateDirectory::StoreProperty<char_const*>
          (cmStateDirectory *this,string *prop,char *value,cmListFileBacktrace *lfbt)

{
  cmListFileBacktrace *pcVar1;
  bool bVar2;
  PointerType pBVar3;
  cmListFileBacktrace local_240;
  allocator<char> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_208;
  cmListFileBacktrace local_1d8;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1a0;
  cmListFileBacktrace local_170;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_138;
  cmListFileBacktrace local_108;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d0;
  cmListFileBacktrace local_a0 [2];
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_58;
  cmListFileBacktrace *local_28;
  cmListFileBacktrace *lfbt_local;
  char *value_local;
  string *prop_local;
  cmStateDirectory *this_local;
  
  local_28 = lfbt;
  lfbt_local = (cmListFileBacktrace *)value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  pcVar1 = lfbt_local;
  if (bVar2) {
    if (lfbt_local == (cmListFileBacktrace *)0x0) {
      ClearIncludeDirectories(this);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,(char *)pcVar1,&local_79);
      cmListFileBacktrace::cmListFileBacktrace(local_a0,local_28);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_58,&local_78,local_a0);
      SetIncludeDirectories(this,&local_58);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_58);
      cmListFileBacktrace::~cmListFileBacktrace(local_a0);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"COMPILE_OPTIONS");
    pcVar1 = lfbt_local;
    if (bVar2) {
      if (lfbt_local == (cmListFileBacktrace *)0x0) {
        ClearCompileOptions(this);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,(char *)pcVar1,&local_f1);
        cmListFileBacktrace::cmListFileBacktrace(&local_108,local_28);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_d0,&local_f0,&local_108);
        SetCompileOptions(this,&local_d0);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_d0);
        cmListFileBacktrace::~cmListFileBacktrace(&local_108);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"COMPILE_DEFINITIONS");
      pcVar1 = lfbt_local;
      if (bVar2) {
        if (lfbt_local == (cmListFileBacktrace *)0x0) {
          ClearCompileDefinitions(this);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,(char *)pcVar1,&local_159);
          cmListFileBacktrace::cmListFileBacktrace(&local_170,local_28);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_138,&local_158,&local_170);
          SetCompileDefinitions(this,&local_138);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_138);
          cmListFileBacktrace::~cmListFileBacktrace(&local_170);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,"LINK_OPTIONS");
        pcVar1 = lfbt_local;
        if (bVar2) {
          if (lfbt_local == (cmListFileBacktrace *)0x0) {
            ClearLinkOptions(this);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1c0,(char *)pcVar1,&local_1c1);
            cmListFileBacktrace::cmListFileBacktrace(&local_1d8,local_28);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                      (&local_1a0,&local_1c0,&local_1d8);
            SetLinkOptions(this,&local_1a0);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT(&local_1a0);
            cmListFileBacktrace::~cmListFileBacktrace(&local_1d8);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::allocator<char>::~allocator(&local_1c1);
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,"LINK_DIRECTORIES");
          pcVar1 = lfbt_local;
          if (bVar2) {
            if (lfbt_local == (cmListFileBacktrace *)0x0) {
              ClearLinkDirectories(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_228,(char *)pcVar1,&local_229);
              cmListFileBacktrace::cmListFileBacktrace(&local_240,local_28);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT(&local_208,&local_228,&local_240);
              SetLinkDirectories(this,&local_208);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT(&local_208);
              cmListFileBacktrace::~cmListFileBacktrace(&local_240);
              std::__cxx11::string::~string((string *)&local_228);
              std::allocator<char>::~allocator(&local_229);
            }
          }
          else {
            pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmPropertyMap::SetProperty(&pBVar3->Properties,(string *)value_local,(char *)lfbt_local)
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmStateDirectory::StoreProperty(const std::string& prop, ValueType value,
                                     cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    if (!value) {
      this->ClearIncludeDirectories();
      return;
    }
    this->SetIncludeDirectories(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    if (!value) {
      this->ClearCompileOptions();
      return;
    }
    this->SetCompileOptions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    if (!value) {
      this->ClearCompileDefinitions();
      return;
    }
    this->SetCompileDefinitions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_OPTIONS") {
    if (!value) {
      this->ClearLinkOptions();
      return;
    }
    this->SetLinkOptions(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_DIRECTORIES") {
    if (!value) {
      this->ClearLinkDirectories();
      return;
    }
    this->SetLinkDirectories(BT<std::string>(value, lfbt));
    return;
  }

  this->DirectoryState->Properties.SetProperty(prop, value);
}